

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerMain.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Player Player;
  
  helics::apps::Player::Player(&Player,argc,argv);
  if (Player.super_App.deactivated == false) {
    helics::apps::App::run(&Player.super_App);
  }
  helics::apps::Player::~Player(&Player);
  helics::cleanupHelicsLibrary();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    int ret = 0;
    try {
        helics::apps::Player Player(argc, argv);
        if (Player.isActive()) {
            Player.run();
        }
    }
    catch (const std::invalid_argument& ia) {
        std::cerr << ia.what() << std::endl;
        ret = -2;
    }
    catch (const helics::HelicsException& he) {
        std::cerr << he.what() << std::endl;
        ret = -4;
    }

    helics::cleanupHelicsLibrary();
    return ret;
}